

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

size_t __thiscall
edition_unittest::TestNestedGroupExtensionInnerExtension::ByteSizeLong
          (TestNestedGroupExtensionInnerExtension *this)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    sVar3 = 0;
  }
  else {
    lVar1 = *(long *)(((ulong)(this->field_0)._impl_.inner_name_.tagged_ptr_.ptr_ &
                      0xfffffffffffffffc) + 8);
    uVar4 = (uint)lVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestNestedGroupExtensionInnerExtension::ByteSizeLong() const {
  const TestNestedGroupExtensionInnerExtension& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestNestedGroupExtensionInnerExtension)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // string inner_name = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_inner_name());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}